

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_kernel_1.cpp
# Opt level: O3

void dlib::
     assign_tables<dlib::logger::global_data::logger_header_container,void(*)(std::ostream&,std::__cxx11::string_const&,dlib::log_level_const&,unsigned_long_long)>
               (logger_header_container *c,string *name,
               _func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_log_level_ptr_unsigned_long_long
               **val)

{
  binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>
  *puVar3;
  range *prVar4;
  tuple<dlib::logger::global_data::logger_header_container_*,_std::default_delete<dlib::logger::global_data::logger_header_container>_>
  c_00;
  unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>
  temp;
  string last;
  string first;
  __uniq_ptr_impl<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>
  local_88 [2];
  undefined1 local_78 [16];
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (name->_M_string_length != 0) {
    lVar2 = std::__cxx11::string::find_first_of((char *)name,0x2c18f8,0);
    std::__cxx11::string::substr((ulong)&local_48,(ulong)name);
    paVar1 = &local_68.field_2;
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    local_68._M_dataplus._M_p = (pointer)paVar1;
    if (lVar2 != -1) {
      std::__cxx11::string::substr((ulong)local_88,(ulong)name);
      std::__cxx11::string::operator=((string *)&local_68,(string *)local_88);
      if (local_88[0]._M_t.
          super__Tuple_impl<0UL,_dlib::logger::global_data::logger_header_container_*,_std::default_delete<dlib::logger::global_data::logger_header_container>_>
          .super__Head_base<0UL,_dlib::logger::global_data::logger_header_container_*,_false>.
          _M_head_impl !=
          (tuple<dlib::logger::global_data::logger_header_container_*,_std::default_delete<dlib::logger::global_data::logger_header_container>_>
           )local_78) {
        operator_delete((void *)local_88[0]._M_t.
                                super__Tuple_impl<0UL,_dlib::logger::global_data::logger_header_container_*,_std::default_delete<dlib::logger::global_data::logger_header_container>_>
                                .
                                super__Head_base<0UL,_dlib::logger::global_data::logger_header_container_*,_false>
                                ._M_head_impl);
      }
    }
    puVar3 = binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::return_reference(&(c->table).
                                 super_map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                                 .bst,(c->table).
                                      super_map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                                      .bst.tree_root,&local_48);
    if (puVar3 == (unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>
                   *)0x0) {
      c_00.
      super__Tuple_impl<0UL,_dlib::logger::global_data::logger_header_container_*,_std::default_delete<dlib::logger::global_data::logger_header_container>_>
      .super__Head_base<0UL,_dlib::logger::global_data::logger_header_container_*,_false>.
      _M_head_impl = (_Tuple_impl<0UL,_dlib::logger::global_data::logger_header_container_*,_std::default_delete<dlib::logger::global_data::logger_header_container>_>
                      )operator_new(0x78);
      (((kernel_1b_c *)
       ((long)c_00.
              super__Tuple_impl<0UL,_dlib::logger::global_data::logger_header_container_*,_std::default_delete<dlib::logger::global_data::logger_header_container>_>
              .super__Head_base<0UL,_dlib::logger::global_data::logger_header_container_*,_false>.
              _M_head_impl + 8))->
      super_map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
      ).
      super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>_>_>
      ._vptr_enumerable = (_func_int **)&PTR__map_kernel_1_00310020;
      (((asc_pair_remover<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)((long)c_00.
                  super__Tuple_impl<0UL,_dlib::logger::global_data::logger_header_container_*,_std::default_delete<dlib::logger::global_data::logger_header_container>_>
                  .
                  super__Head_base<0UL,_dlib::logger::global_data::logger_header_container_*,_false>
                  ._M_head_impl + 0x10))->
      super_pair_remover<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>_>
      )._vptr_pair_remover = (_func_int **)&PTR__map_kernel_1_00310080;
      binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::binary_search_tree_kernel_2
                ((binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)c_00.
                           super__Tuple_impl<0UL,_dlib::logger::global_data::logger_header_container_*,_std::default_delete<dlib::logger::global_data::logger_header_container>_>
                           .
                           super__Head_base<0UL,_dlib::logger::global_data::logger_header_container_*,_false>
                           ._M_head_impl + 0x18));
      (((kernel_1b_c *)
       ((long)c_00.
              super__Tuple_impl<0UL,_dlib::logger::global_data::logger_header_container_*,_std::default_delete<dlib::logger::global_data::logger_header_container>_>
              .super__Head_base<0UL,_dlib::logger::global_data::logger_header_container_*,_false>.
              _M_head_impl + 8))->
      super_map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
      ).
      super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>_>_>
      ._vptr_enumerable = (_func_int **)&PTR__map_kernel_1_00310d48;
      (((asc_pair_remover<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)((long)c_00.
                  super__Tuple_impl<0UL,_dlib::logger::global_data::logger_header_container_*,_std::default_delete<dlib::logger::global_data::logger_header_container>_>
                  .
                  super__Head_base<0UL,_dlib::logger::global_data::logger_header_container_*,_false>
                  ._M_head_impl + 0x10))->
      super_pair_remover<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>_>
      )._vptr_pair_remover = (_func_int **)&DAT_00310da8;
      *(print_header_type *)
       c_00.
       super__Tuple_impl<0UL,_dlib::logger::global_data::logger_header_container_*,_std::default_delete<dlib::logger::global_data::logger_header_container>_>
       .super__Head_base<0UL,_dlib::logger::global_data::logger_header_container_*,_false>.
       _M_head_impl = c->val;
      local_88[0]._M_t.
      super__Tuple_impl<0UL,_dlib::logger::global_data::logger_header_container_*,_std::default_delete<dlib::logger::global_data::logger_header_container>_>
      .super__Head_base<0UL,_dlib::logger::global_data::logger_header_container_*,_false>.
      _M_head_impl = (tuple<dlib::logger::global_data::logger_header_container_*,_std::default_delete<dlib::logger::global_data::logger_header_container>_>
                      )(tuple<dlib::logger::global_data::logger_header_container_*,_std::default_delete<dlib::logger::global_data::logger_header_container>_>
                        )c_00.
                         super__Tuple_impl<0UL,_dlib::logger::global_data::logger_header_container_*,_std::default_delete<dlib::logger::global_data::logger_header_container>_>
                         .
                         super__Head_base<0UL,_dlib::logger::global_data::logger_header_container_*,_false>
                         ._M_head_impl;
      assign_tables<dlib::logger::global_data::logger_header_container,void(*)(std::ostream&,std::__cxx11::string_const&,dlib::log_level_const&,unsigned_long_long)>
                ((logger_header_container *)
                 c_00.
                 super__Tuple_impl<0UL,_dlib::logger::global_data::logger_header_container_*,_std::default_delete<dlib::logger::global_data::logger_header_container>_>
                 .super__Head_base<0UL,_dlib::logger::global_data::logger_header_container_*,_false>
                 ._M_head_impl,&local_68,val);
      map_kernel_c<dlib::map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
      ::add(&c->table,&local_48,(range *)local_88);
      std::
      unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>
      ::~unique_ptr((unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>
                     *)local_88);
    }
    else {
      prVar4 = map_kernel_c<dlib::map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
               ::operator[](&c->table,&local_48);
      assign_tables<dlib::logger::global_data::logger_header_container,void(*)(std::ostream&,std::__cxx11::string_const&,dlib::log_level_const&,unsigned_long_long)>
                ((prVar4->_M_t).
                 super___uniq_ptr_impl<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_dlib::logger::global_data::logger_header_container_*,_std::default_delete<dlib::logger::global_data::logger_header_container>_>
                 .super__Head_base<0UL,_dlib::logger::global_data::logger_header_container_*,_false>
                 ._M_head_impl,&local_68,val);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    return;
  }
  c->val = (print_header_type)*val;
  this = &(c->table).
          super_map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
          .bst;
  if ((c->table).
      super_map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
      .bst.tree_size != 0) {
    binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::delete_tree(this,(c->table).
                       super_map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                       .bst.tree_root);
    (c->table).
    super_map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
    .bst.tree_root =
         (c->table).
         super_map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
         .bst.NIL;
    (c->table).
    super_map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
    .bst.tree_size = 0;
  }
  (*(this->
    super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::logger_header_container,_std::default_delete<dlib::logger::global_data::logger_header_container>_>_>_>
    )._vptr_enumerable[3])(this);
  return;
}

Assistant:

void assign_tables (
        T& c,
        const std::string& name,
        const U& val
    )
    {
        if (name.size() == 0)
        {
            c.val = val;
            c.table.clear();
            return;
        }

        const std::string::size_type pos = name.find_first_of(".");
        std::string first = name.substr(0,pos);
        std::string last;
        if (pos != std::string::npos)
            last = name.substr(pos+1);

        if (c.table.is_in_domain(first))
        {
            assign_tables(*c.table[first], last, val); 
        }
        else
        {
            std::unique_ptr<T> temp (new T);
            temp->val = c.val;
            assign_tables(*temp, last, val);
            c.table.add(first,temp);
        }
    }